

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_huff.c
# Opt level: O0

block_state deflate_huff(deflate_state *s,int flush)

{
  int iVar1;
  uchar *local_50;
  uchar *local_40;
  uchar *local_30;
  int bflush;
  int flush_local;
  deflate_state *s_local;
  
  while ((s->lookahead != 0 || (fill_window(s), s->lookahead != 0))) {
    iVar1 = zng_tr_tally_lit(s,s->window[s->strstart]);
    s->lookahead = s->lookahead - 1;
    s->strstart = s->strstart + 1;
    if (iVar1 != 0) {
      if (s->block_start < 0) {
        local_30 = (uchar *)0x0;
      }
      else {
        local_30 = s->window + (uint)s->block_start;
      }
      zng_tr_flush_block(s,(char *)local_30,s->strstart - s->block_start,0);
      s->block_start = s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
  }
  if (flush == 0) {
    return need_more;
  }
  s->insert = 0;
  if (flush != 4) {
    if (s->sym_next != 0) {
      if (s->block_start < 0) {
        local_50 = (uchar *)0x0;
      }
      else {
        local_50 = s->window + (uint)s->block_start;
      }
      zng_tr_flush_block(s,(char *)local_50,s->strstart - s->block_start,0);
      s->block_start = s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
    return block_done;
  }
  if (s->block_start < 0) {
    local_40 = (uchar *)0x0;
  }
  else {
    local_40 = s->window + (uint)s->block_start;
  }
  zng_tr_flush_block(s,(char *)local_40,s->strstart - s->block_start,1);
  s->block_start = s->strstart;
  flush_pending(s->strm);
  if (s->strm->avail_out == 0) {
    return finish_started;
  }
  return finish_done;
}

Assistant:

Z_INTERNAL block_state deflate_huff(deflate_state *s, int flush) {
    int bflush = 0;         /* set if current block must be flushed */

    for (;;) {
        /* Make sure that we have a literal to write. */
        if (s->lookahead == 0) {
            PREFIX(fill_window)(s);
            if (s->lookahead == 0) {
                if (flush == Z_NO_FLUSH)
                    return need_more;
                break;      /* flush the current block */
            }
        }

        /* Output a literal byte */
        bflush = zng_tr_tally_lit(s, s->window[s->strstart]);
        s->lookahead--;
        s->strstart++;
        if (bflush)
            FLUSH_BLOCK(s, 0);
    }
    s->insert = 0;
    if (flush == Z_FINISH) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (s->sym_next)
        FLUSH_BLOCK(s, 0);
    return block_done;
}